

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

int __thiscall OpenMD::ElementsTable::GetAtomicNum(ElementsTable *this,char *identifier,int *iso)

{
  Element *__s1;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  reference ppEVar6;
  undefined4 *in_RDX;
  Element *in_RSI;
  byte *in_RDI;
  int numCharsToTest;
  iterator i;
  ElementsTable *in_stack_00008060;
  Element *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  string local_78 [32];
  Element **local_58;
  Element **local_50;
  int local_44;
  int local_40;
  int local_3c;
  Element **local_38;
  Element **local_30;
  __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
  local_28;
  undefined4 *local_20;
  Element *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((*in_RDI & 1) == 0) {
    Init(in_stack_00008060);
  }
  __gnu_cxx::
  __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (Element **)
             std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::begin
                       ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                        in_stack_ffffffffffffff68);
  local_28._M_current = local_30;
  while( true ) {
    local_38 = (Element **)
               std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::end
                         ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                          in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                        *)in_stack_ffffffffffffff68);
    __s1 = local_18;
    if (!bVar1) {
      sVar3 = strlen((char *)local_18);
      local_40 = (int)sVar3;
      local_44 = 5;
      piVar4 = std::max<int>(&local_40,&local_44);
      local_3c = *piVar4;
      local_50 = (Element **)
                 std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::begin
                           ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                            in_stack_ffffffffffffff68);
      local_28._M_current = local_50;
      while( true ) {
        local_58 = (Element **)
                   std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::end
                             ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                              in_stack_ffffffffffffff68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) {
          iVar2 = strcasecmp((char *)local_18,"D");
          if ((iVar2 == 0) || (iVar2 = strcasecmp((char *)local_18,"Deuterium"), iVar2 == 0)) {
            *local_20 = 2;
            local_4 = 1;
          }
          else {
            iVar2 = strcasecmp((char *)local_18,"T");
            if ((iVar2 == 0) || (iVar2 = strcasecmp((char *)local_18,"Tritium"), iVar2 == 0)) {
              *local_20 = 3;
              local_4 = 1;
            }
            else {
              iVar2 = strcasecmp((char *)local_18,"Hl");
              if (iVar2 == 0) {
                snprintf(painCave.errMsg,2000,
                         "ElementsTable warning.\n\tCannot understand the element label %s\n\tGuessing it\'s hydrogen\n"
                         ,local_18);
                painCave.isFatal = 0;
                painCave.severity = 2;
                simError();
                local_4 = 1;
              }
              else {
                *local_20 = 0;
                local_4 = 0;
              }
            }
          }
          return local_4;
        }
        in_stack_ffffffffffffff68 = local_18;
        __gnu_cxx::
        __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
        ::operator*(&local_28);
        Element::GetName_abi_cxx11_(in_stack_ffffffffffffff68);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        in_stack_ffffffffffffff74 =
             strncasecmp((char *)in_stack_ffffffffffffff68,pcVar5,(long)local_3c);
        std::__cxx11::string::~string(local_78);
        if (in_stack_ffffffffffffff74 == 0) break;
        __gnu_cxx::
        __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
        ::operator++(&local_28);
      }
      ppEVar6 = __gnu_cxx::
                __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                ::operator*(&local_28);
      iVar2 = Element::GetAtomicNum(*ppEVar6);
      return iVar2;
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
    ::operator*(&local_28);
    pcVar5 = Element::GetSymbol((Element *)0x38cb2c);
    iVar2 = strncasecmp((char *)__s1,pcVar5,3);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
    ::operator++(&local_28);
  }
  ppEVar6 = __gnu_cxx::
            __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
            ::operator*(&local_28);
  iVar2 = Element::GetAtomicNum(*ppEVar6);
  return iVar2;
}

Assistant:

int ElementsTable::GetAtomicNum(const char* identifier, int& iso) {
    if (!init_) Init();

    // Compare to symbol
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (!strncasecmp(identifier, (*i)->GetSymbol(), 3))
        return ((*i)->GetAtomicNum());

    // Compare to IUPAC name (an abbreviated name will also work if 5
    // letters or more)
    int numCharsToTest = std::max<int>(strlen(identifier), 5);
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (strncasecmp(identifier, (*i)->GetName().c_str(), numCharsToTest) == 0)
        return ((*i)->GetAtomicNum());

    if (strcasecmp(identifier, "D") == 0 ||
        (strcasecmp(identifier, "Deuterium") == 0)) {
      iso = 2;
      return (1);
    } else if (strcasecmp(identifier, "T") == 0 ||
               (strcasecmp(identifier, "Tritium") == 0)) {
      iso = 3;
      return (1);
    } else if (strcasecmp(identifier, "Hl") == 0) {
      // ligand hydrogen -- found in some CIF PR#3048959.
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable warning.\n"
               "\tCannot understand the element label %s\n"
               "\tGuessing it's hydrogen\n",
               identifier);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();
      return (1);
    } else
      iso = 0;

    if (identifier[0] != '*') {
      // Quiet down the error messages for now:
      // snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //          "ElementsTable warning.\n"
      //          "\tCannot understand the element label %s\n", identifier);
      // painCave.isFatal = 0;
      // painCave.severity = OPENMD_WARNING;
      // simError();
    }
    return (0);
  }